

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorProto::FileDescriptorProto(FileDescriptorProto *this,Arena *arena)

{
  Arena *in_RSI;
  FileDescriptorProto *in_RDI;
  Arena *in_stack_ffffffffffffff88;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *in_stack_ffffffffffffff90;
  FileDescriptorProto *this_00;
  
  Message::Message((Message *)in_stack_ffffffffffffff90);
  (in_RDI->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileDescriptorProto_008d8380;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  memset(&in_RDI->_has_bits_,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x4ecf68);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  RepeatedPtrField<google::protobuf::DescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::DescriptorProto> *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  this_00 = (FileDescriptorProto *)&in_RDI->service_;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)in_stack_ffffffffffffff90
             ,in_stack_ffffffffffffff88);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::RepeatedPtrField
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  RepeatedField<int>::RepeatedField(&in_RDI->public_dependency_,in_RSI);
  RepeatedField<int>::RepeatedField(&in_RDI->weak_dependency_,in_RSI);
  SharedCtor(this_00);
  RegisterArenaDtor(in_RDI,in_RSI);
  return;
}

Assistant:

FileDescriptorProto::FileDescriptorProto(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
  _internal_metadata_(arena),
  dependency_(arena),
  message_type_(arena),
  enum_type_(arena),
  service_(arena),
  extension_(arena),
  public_dependency_(arena),
  weak_dependency_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:google.protobuf.FileDescriptorProto)
}